

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

Breakdown * __thiscall absl::Time::In(Breakdown *__return_storage_ptr__,Time *this,Impl *param_3)

{
  uint32_t uVar1;
  char cVar2;
  int iVar3;
  HiRep HVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  absolute_lookup al;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  time_zone local_60;
  absolute_lookup local_58;
  HiRep local_38;
  
  HVar4.lo_ = 0xffffffff;
  HVar4.hi_ = 0x7fffffff;
  local_38 = (this->rep_).rep_hi_;
  uVar1 = (this->rep_).rep_lo_;
  if (uVar1 == 0xffffffff && local_38 == (HiRep)0x7fffffffffffffff) {
    *(undefined8 *)&(__return_storage_ptr__->subsecond).rep_lo_ = 0x400000000;
    __return_storage_ptr__->yearday = 0x16d;
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->year = 0x7fffffffffffffff;
    __return_storage_ptr__->month = 0xc;
    __return_storage_ptr__->day = 0x1f;
    __return_storage_ptr__->hour = 0x17;
    __return_storage_ptr__->minute = 0x3b;
    __return_storage_ptr__->second = 0x3b;
  }
  else {
    HVar4.lo_ = 0;
    HVar4.hi_ = 0x80000000;
    if (local_38 != (HiRep)0x8000000000000000 || uVar1 != 0xffffffff) {
      local_60.impl_ = param_3;
      time_internal::cctz::time_zone::lookup(&local_58,&local_60,(time_point<seconds> *)&local_38);
      uVar6 = 0;
      (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0;
      (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0;
      (__return_storage_ptr__->subsecond).rep_lo_ = 0;
      __return_storage_ptr__->year = local_58.cs.f_.y;
      cVar5 = local_58.cs.f_.m;
      __return_storage_ptr__->month = (int)cVar5;
      cVar2 = local_58.cs.f_.d;
      __return_storage_ptr__->day = (int)cVar2;
      __return_storage_ptr__->hour = (int)local_58.cs.f_.hh;
      __return_storage_ptr__->minute = local_58.cs.f_._8_4_ >> 0x18;
      __return_storage_ptr__->second = local_58.cs.f_._9_4_ >> 0x18;
      uVar1 = (this->rep_).rep_lo_;
      (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0;
      (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0;
      (__return_storage_ptr__->subsecond).rep_lo_ = uVar1;
      uVar7 = (local_58.cs.f_.y % 400 - (ulong)(cVar5 < '\x03')) + 0x960;
      iVar3 = *(int *)(&DAT_001ca618 +
                      ((long)(uVar7 / 400 + (uVar7 >> 2) +
                              (long)cVar2 + (long)*(int *)(&DAT_001ca640 + (long)cVar5 * 4) +
                             (uVar7 - (uVar7 >> 2) / 0x19)) % 7) * 4) + 1;
      if (5 < *(int *)(&DAT_001ca618 +
                      ((long)(uVar7 / 400 + (uVar7 >> 2) +
                              (long)cVar2 + (long)*(int *)(&DAT_001ca640 + (long)cVar5 * 4) +
                             (uVar7 - (uVar7 >> 2) / 0x19)) % 7) * 4) - 1U) {
        iVar3 = 1;
      }
      __return_storage_ptr__->weekday = iVar3;
      if (((local_58.cs.f_.y & 3U) == 0 && '\x02' < cVar5) &&
         (uVar6 = 1,
         (local_58.cs.f_.y * -0x70a3d70a3d70a3d7 + 0x51eb851eb851eb8U >> 2 |
         local_58.cs.f_.y * -0x70a3d70a3d70a3d7 << 0x3e) < 0x28f5c28f5c28f5d)) {
        uVar6 = (uint)(local_58.cs.f_.y % 400 == 0);
      }
      __return_storage_ptr__->yearday =
           uVar6 + (int)cVar2 + *(int *)(&DAT_001ca680 + (long)cVar5 * 4);
      __return_storage_ptr__->offset = local_58.offset;
      __return_storage_ptr__->is_dst = local_58.is_dst;
      goto LAB_001857c8;
    }
    *(undefined8 *)&(__return_storage_ptr__->subsecond).rep_lo_ = 0x700000000;
    __return_storage_ptr__->yearday = 1;
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->year = -0x8000000000000000;
    __return_storage_ptr__->month = 1;
    __return_storage_ptr__->day = 1;
    __return_storage_ptr__->hour = 0;
    __return_storage_ptr__->minute = 0;
    __return_storage_ptr__->second = 0;
  }
  (__return_storage_ptr__->subsecond).rep_hi_ = HVar4;
  (__return_storage_ptr__->subsecond).rep_lo_ = 0xffffffff;
  __return_storage_ptr__->is_dst = false;
  local_58.abbr = "-00";
LAB_001857c8:
  __return_storage_ptr__->zone_abbr = local_58.abbr;
  return __return_storage_ptr__;
}

Assistant:

ABSL_INTERNAL_DISABLE_DEPRECATED_DECLARATION_WARNING
absl::Time::Breakdown Time::In(absl::TimeZone tz) const {
  if (*this == absl::InfiniteFuture()) return InfiniteFutureBreakdown();
  if (*this == absl::InfinitePast()) return InfinitePastBreakdown();

  const auto tp = unix_epoch() + cctz::seconds(time_internal::GetRepHi(rep_));
  const auto al = cctz::time_zone(tz).lookup(tp);
  const auto cs = al.cs;
  const auto cd = cctz::civil_day(cs);

  absl::Time::Breakdown bd;
  bd.year = cs.year();
  bd.month = cs.month();
  bd.day = cs.day();
  bd.hour = cs.hour();
  bd.minute = cs.minute();
  bd.second = cs.second();
  bd.subsecond = time_internal::MakeDuration(0, time_internal::GetRepLo(rep_));
  bd.weekday = MapWeekday(cctz::get_weekday(cd));
  bd.yearday = cctz::get_yearday(cd);
  bd.offset = al.offset;
  bd.is_dst = al.is_dst;
  bd.zone_abbr = al.abbr;
  return bd;
}